

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINGetNumBacktrackOps(void *kinmem,long *nbacktr)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x3e4,"KINGetNumBacktrackOps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *nbacktr = *(long *)((long)kinmem + 0xf8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumBacktrackOps(void* kinmem, long int* nbacktr)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem  = (KINMem)kinmem;
  *nbacktr = kin_mem->kin_nbktrk;

  return (KIN_SUCCESS);
}